

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

Matrix3f * __thiscall Matrix3f::transposed(Matrix3f *this)

{
  float fVar1;
  float *pfVar2;
  Matrix3f *in_RSI;
  Matrix3f *in_RDI;
  int j;
  int i;
  Matrix3f *out;
  undefined4 local_18;
  undefined4 local_14;
  
  Matrix3f(in_RDI,0.0);
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      pfVar2 = operator()(in_RSI,local_14,local_18);
      fVar1 = *pfVar2;
      pfVar2 = operator()(in_RDI,local_18,local_14);
      *pfVar2 = fVar1;
    }
  }
  return in_RDI;
}

Assistant:

Matrix3f Matrix3f::transposed() const
{
	Matrix3f out;
	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			out( j, i ) = ( *this )( i, j );
		}
	}

	return out;
}